

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O0

void raviX_generate_C_tofile(LinearizerState *linearizer,char *mainfunc,FILE *fp)

{
  char *local_50;
  undefined1 local_40 [8];
  TextBuffer mb;
  Ravi_CompilerInterface *ravi_interface;
  FILE *fp_local;
  char *mainfunc_local;
  LinearizerState *linearizer_local;
  
  mb.pos = (size_t)&stub_compilerInterface;
  local_50 = mainfunc;
  if (mainfunc == (char *)0x0) {
    local_50 = "setup";
  }
  raviX_string_copy(stub_compilerInterface.main_func_name,local_50,0x1f);
  raviX_buffer_init((TextBuffer *)local_40,0x1000);
  raviX_generate_C(linearizer,(TextBuffer *)local_40,(Ravi_CompilerInterface *)0x0);
  fprintf((FILE *)fp,"%s\n",local_40);
  raviX_buffer_free((TextBuffer *)local_40);
  return;
}

Assistant:

void raviX_generate_C_tofile(LinearizerState *linearizer, const char *mainfunc, FILE *fp)
{
	struct Ravi_CompilerInterface *ravi_interface = &stub_compilerInterface;
	raviX_string_copy(ravi_interface->main_func_name, (mainfunc != NULL ? mainfunc : "setup"),
			  sizeof ravi_interface->main_func_name);
	TextBuffer mb;
	raviX_buffer_init(&mb, 4096);
	raviX_generate_C(linearizer, &mb, NULL);
	fprintf(fp, "%s\n", mb.buf);
	raviX_buffer_free(&mb);
}